

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O1

void __thiscall CCNR::ls_solver::print_solution(ls_solver *this,bool need_verify)

{
  pointer pcVar1;
  pointer plVar2;
  undefined8 in_RAX;
  long lVar3;
  char *pcVar4;
  pointer plVar5;
  bool bVar6;
  ostream *poVar7;
  size_t sVar8;
  ulong uVar9;
  undefined8 uStack_38;
  
  if ((int)((ulong)((long)(this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_unsat_clauses).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 2) == 0) {
    pcVar4 = "s SATISFIABLE";
    lVar3 = 0xd;
  }
  else {
    pcVar4 = "s UNKNOWN";
    lVar3 = 9;
  }
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  poVar7 = (ostream *)&std::cout;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  if (need_verify) {
    if (this->_num_clauses != 0) {
      pcVar1 = (this->_clauses).super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>.
               _M_impl.super__Vector_impl_data._M_start;
      sVar8 = 0;
      do {
        plVar5 = *(pointer *)
                  &pcVar1[sVar8].literals.super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>.
                   _M_impl;
        plVar2 = *(pointer *)
                  ((long)&pcVar1[sVar8].literals.
                          super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 8);
        if (plVar5 == plVar2) {
LAB_0012df16:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"c Error: verify error in clause ",0x20);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          goto LAB_0012df3f;
        }
        do {
          bVar6 = false;
          if ((*(uint *)plVar5 & 1) ==
              (int)(this->_solution).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[plVar5->var_num]) {
            bVar6 = true;
            break;
          }
          plVar5 = plVar5 + 1;
        } while (plVar5 != plVar2);
        if (!bVar6) goto LAB_0012df16;
        sVar8 = sVar8 + 1;
      } while (sVar8 != this->_num_clauses);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"c Verified.",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
  }
  uVar9 = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"v",1);
  if (this->_num_vars != 0) {
    poVar7 = (ostream *)&std::cout;
    do {
      uStack_38._0_7_ = CONCAT16(0x20,(undefined6)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)((long)&uStack_38 + 6),1);
      if ((this->_solution).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] == '\0') {
        uStack_38 = CONCAT17(0x2d,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
      }
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      uVar9 = uVar9 + 1;
    } while (uVar9 <= this->_num_vars);
  }
LAB_0012df3f:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  return;
}

Assistant:

void ls_solver::print_solution(bool need_verify)
{
    if (0 == get_cost())
        cout << "s SATISFIABLE" << endl;
    else
        cout << "s UNKNOWN" << endl;
    bool sat_flag = false;
    if (need_verify) {
        for (size_t c = 0; c < _num_clauses; c++) {
            sat_flag = false;
            for (lit l : _clauses[c].literals) {
                if (_solution[l.var_num] == l.sense) {
                    sat_flag = true;
                    break;
                }
            }
            if (!sat_flag) {
                cout << "c Error: verify error in clause " << c << endl;
                return;
            }
        }
        cout << "c Verified." << endl;
    }
    cout << "v";
    for (size_t v = 1; v <= _num_vars; v++) {
        cout << ' ';
        if (_solution[v] == 0) cout << '-';
        cout << v;
    }
    cout << endl;
}